

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

Validity * __thiscall
capnp::compiler::CompilerMain::setRootType
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr input)

{
  SourceFile *pSVar1;
  Builder result;
  Reader expression;
  undefined8 uVar2;
  StructSchema SVar3;
  long lVar4;
  uint32_t startByte;
  size_t sVar5;
  bool bVar6;
  StringPtr message;
  StringPtr message_00;
  ArrayPtr<const_char> input_00;
  Orphanage orphanageParam;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  IVar7;
  StringPtr message_01;
  StringPtr message_02;
  StringPtr message_03;
  StringPtr message_04;
  CliArgumentErrorReporter errorReporter;
  ParserInput parserInput;
  Maybe<capnp::Type> local_4f8;
  NullableValue<capnp::Orphan<capnp::compiler::Expression>_> _expression1246;
  Builder lexedTokens;
  NullableValue<capnp::compiler::Compiler::CompiledType> _compiledType1251;
  Reader local_3d0;
  Reader tokens;
  NullableValue<capnp::Type> _type1252;
  MallocMessageBuilder tokenArena;
  CapnpParser parser;
  
  lVar4 = (long)(this->sourceFiles).builder.pos - (long)(this->sourceFiles).builder.ptr;
  parser.orphanage.arena = (BuilderArena *)(lVar4 / 0x38);
  parser.orphanage.capTable._0_4_ = 1;
  parser.errorReporter = (ErrorReporter *)anon_var_dwarf_48c59;
  parser.arena.nextChunkSize = 5;
  parser.arena.chunkList._0_1_ = lVar4 == 0x38;
  if (!(bool)parser.arena.chunkList._0_1_) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
              ((Fault *)&tokenArena,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
               ,0x4b0,FAILED,"sourceFiles.size() == 1","_kjCondition,",
               (DebugComparison<unsigned_long,_int> *)&parser);
    kj::_::Debug::Fault::fatal((Fault *)&tokenArena);
  }
  errorReporter.super_ErrorReporter._vptr_ErrorReporter = (_func_int **)&PTR_StringPtr__002729a0;
  errorReporter.error.ptr.isSet = false;
  MallocMessageBuilder::MallocMessageBuilder(&tokenArena,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnp::compiler::LexedTokens>
            (&lexedTokens,&tokenArena.super_MessageBuilder);
  sVar5 = input.content.size_ - 1;
  result._builder.capTable = lexedTokens._builder.capTable;
  result._builder.segment = lexedTokens._builder.segment;
  result._builder.data = lexedTokens._builder.data;
  result._builder.pointers = lexedTokens._builder.pointers;
  result._builder.dataSize = lexedTokens._builder.dataSize;
  result._builder.pointerCount = lexedTokens._builder.pointerCount;
  result._builder._38_2_ = lexedTokens._builder._38_2_;
  input_00.size_ = sVar5;
  input_00.ptr = input.content.ptr;
  lex(input_00,result,&errorReporter.super_ErrorReporter);
  orphanageParam = MessageBuilder::getOrphanage(&tokenArena.super_MessageBuilder);
  CapnpParser::CapnpParser(&parser,orphanageParam,&errorReporter.super_ErrorReporter);
  capnp::_::StructBuilder::asReader(&lexedTokens._builder);
  LexedTokens::Reader::getTokens(&tokens,(Reader *)&_compiledType1251);
  parserInput.parent =
       (IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
        *)0x0;
  parserInput.pos.index = 0;
  parserInput.end.index = tokens.reader.elementCount;
  parserInput.best.index = 0;
  parserInput.pos.container = &tokens;
  parserInput.end.container = &tokens;
  parserInput.best.container = &tokens;
  if (tokens.reader.elementCount == 0) {
    message_01.content.size_ = 0x1a;
    message_01.content.ptr = "Couldn\'t parse type name.";
    setRootType(kj::StringPtr)::CliArgumentErrorReporter::addError(unsigned_int,unsigned_int,kj::
    StringPtr_(&errorReporter,0,0,message_01);
  }
  else {
    (*(code *)**(undefined8 **)parser.parsers.expression.wrapper)
              (&_compiledType1251,parser.parsers.expression.wrapper,parser.parsers.expression.parser
              );
    kj::_::NullableValue<capnp::Orphan<capnp::compiler::Expression>_>::NullableValue
              (&_expression1246,
               (NullableValue<capnp::Orphan<capnp::compiler::Expression>_> *)&_compiledType1251);
    kj::_::NullableValue<capnp::Orphan<capnp::compiler::Expression>_>::~NullableValue
              ((NullableValue<capnp::Orphan<capnp::compiler::Expression>_> *)&_compiledType1251);
    if (_expression1246.isSet == true) {
      if (parserInput.pos.index != tokens.reader.elementCount) {
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
        ::operator*((Reader *)&_compiledType1251,&parserInput.pos);
        message.content.size_ = 0x1a;
        message.content.ptr = "Couldn\'t parse type name.";
        ErrorReporter::addErrorOn<capnp::compiler::Token::Reader>
                  (&errorReporter.super_ErrorReporter,(Reader *)&_compiledType1251,message);
        goto LAB_0011d185;
      }
      pSVar1 = (this->sourceFiles).builder.ptr;
      capnp::_::OrphanGetImpl<capnp::compiler::Expression,_(capnp::Kind)3>::applyReader
                (&local_3d0,&_expression1246.field_1.value.builder);
      expression._reader.capTable = local_3d0._reader.capTable;
      expression._reader.segment = local_3d0._reader.segment;
      expression._reader.data = local_3d0._reader.data;
      expression._reader.pointers = local_3d0._reader.pointers;
      expression._reader.dataSize = local_3d0._reader.dataSize;
      expression._reader.pointerCount = local_3d0._reader.pointerCount;
      expression._reader._38_2_ = local_3d0._reader._38_2_;
      expression._reader.nestingLimit = local_3d0._reader.nestingLimit;
      expression._reader._44_4_ = local_3d0._reader._44_4_;
      Compiler::ModuleScope::evalType
                ((Maybe<capnp::compiler::Compiler::CompiledType> *)&_type1252,&pSVar1->compiled,
                 expression,&errorReporter.super_ErrorReporter);
      kj::_::NullableValue<capnp::compiler::Compiler::CompiledType>::NullableValue
                (&_compiledType1251,
                 (NullableValue<capnp::compiler::Compiler::CompiledType> *)&_type1252);
      kj::_::NullableValue<capnp::compiler::Compiler::CompiledType>::~NullableValue
                ((NullableValue<capnp::compiler::Compiler::CompiledType> *)&_type1252);
      if (_compiledType1251.isSet == true) {
        Compiler::CompiledType::getSchema(&local_4f8,&_compiledType1251.field_1.value);
        _type1252.isSet = local_4f8.ptr.isSet;
        if (local_4f8.ptr.isSet == true) {
          _type1252.field_1._0_8_ = local_4f8.ptr.field_1._0_8_;
          uVar2 = _type1252.field_1._0_8_;
          _type1252.field_1.value.field_4 = local_4f8.ptr.field_1.value.field_4;
          _type1252.field_1.value.baseType = (Which)local_4f8.ptr.field_1._0_8_;
          _type1252.field_1._0_8_ = uVar2;
          if ((_type1252.field_1.value.baseType == STRUCT) &&
             (_type1252.field_1.value.listDepth =
                   (uint8_t)((ulong)local_4f8.ptr.field_1._0_8_ >> 0x10),
             _type1252.field_1.value.listDepth == '\0')) {
            SVar3 = Type::asStruct(&_type1252.field_1.value);
            (this->rootType).super_Schema.raw = (RawBrandedSchema *)SVar3.super_Schema.raw;
            bVar6 = true;
          }
          else {
            bVar6 = false;
            message_04.content.size_ = 0x16;
            message_04.content.ptr = "Type is not a struct.";
            setRootType(kj::StringPtr)::CliArgumentErrorReporter::
            addError(unsigned_int,unsigned_int,kj::StringPtr_(&errorReporter,0,0,message_04);
          }
        }
        else {
          bVar6 = false;
          message_03.content.size_ = 0x16;
          message_03.content.ptr = "Type is not a struct.";
          setRootType(kj::StringPtr)::CliArgumentErrorReporter::
          addError(unsigned_int,unsigned_int,kj::StringPtr_(&errorReporter,0,0,message_03);
        }
      }
      else {
        bVar6 = false;
      }
      kj::_::NullableValue<capnp::compiler::Compiler::CompiledType>::~NullableValue
                (&_compiledType1251);
    }
    else {
      IVar7 = kj::parse::
              IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
              ::getBest(&parserInput);
      _type1252._0_8_ = IVar7.container;
      _type1252.field_1._0_4_ = IVar7.index;
      if (IVar7.index == tokens.reader.elementCount) {
        startByte = (uint32_t)sVar5;
        message_02.content.size_ = 0x1a;
        message_02.content.ptr = "Couldn\'t parse type name.";
        setRootType(kj::StringPtr)::CliArgumentErrorReporter::addError(unsigned_int,unsigned_int,kj
        ::StringPtr_(&errorReporter,startByte,startByte,message_02);
      }
      else {
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
        ::operator*((Reader *)&_compiledType1251,
                    (IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
                     *)&_type1252);
        message_00.content.size_ = 0x1a;
        message_00.content.ptr = "Couldn\'t parse type name.";
        ErrorReporter::addErrorOn<capnp::compiler::Token::Reader>
                  (&errorReporter.super_ErrorReporter,(Reader *)&_compiledType1251,message_00);
      }
LAB_0011d185:
      bVar6 = false;
    }
    kj::_::NullableValue<capnp::Orphan<capnp::compiler::Expression>_>::~NullableValue
              (&_expression1246);
    if (bVar6) goto LAB_0011d1fd;
  }
  _type1252.isSet = errorReporter.error.ptr.isSet;
  if (errorReporter.error.ptr.isSet == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
              ((Fault *)&_compiledType1251,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
               ,0x4fd,FAILED,"success || errorReporter.hadErrors()","_kjCondition,",&_type1252.isSet
              );
    kj::_::Debug::Fault::fatal((Fault *)&_compiledType1251);
  }
LAB_0011d1fd:
  bVar6 = (errorReporter.error.ptr.isSet & 1U) != 0;
  if (bVar6) {
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr =
         errorReporter.error.ptr.field_1.value.content.ptr;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ =
         errorReporter.error.ptr.field_1.value.content.size_;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer =
         errorReporter.error.ptr.field_1.value.content.disposer;
    errorReporter.error.ptr.field_1.value.content.ptr = (char *)0x0;
    errorReporter.error.ptr.field_1.value.content.size_ = 0;
  }
  (__return_storage_ptr__->errorMessage).ptr.isSet = bVar6;
  kj::parse::
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  ::~IteratorInput(&parserInput);
  CapnpParser::~CapnpParser(&parser);
  MallocMessageBuilder::~MallocMessageBuilder(&tokenArena);
  setRootType::CliArgumentErrorReporter::~CliArgumentErrorReporter(&errorReporter);
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity setRootType(kj::StringPtr input) {
    KJ_ASSERT(sourceFiles.size() == 1);

    class CliArgumentErrorReporter: public ErrorReporter {
    public:
      void addError(uint32_t startByte, uint32_t endByte, kj::StringPtr message) override {
        if (startByte < endByte) {
          error = kj::str(startByte + 1, "-", endByte, ": ", message);
        } else if (startByte > 0) {
          error = kj::str(startByte + 1, ": ", message);
        } else {
          error = kj::str(message);
        }
      }

      bool hadErrors() override {
        return error != kj::none;
      }

      kj::MainBuilder::Validity getValidity() {
        KJ_IF_SOME(e, error) {
          return kj::mv(e);
        } else {
          return true;
        }
      }

    private:
      kj::Maybe<kj::String> error;
    };

    CliArgumentErrorReporter errorReporter;

    capnp::MallocMessageBuilder tokenArena;
    auto lexedTokens = tokenArena.initRoot<capnp::compiler::LexedTokens>();
    lex(input, lexedTokens, errorReporter);

    CapnpParser parser(tokenArena.getOrphanage(), errorReporter);
    auto tokens = lexedTokens.asReader().getTokens();
    CapnpParser::ParserInput parserInput(tokens.begin(), tokens.end());

    bool success = false;

    if (parserInput.getPosition() == tokens.end()) {
      // Empty argument?
      errorReporter.addError(0, 0, "Couldn't parse type name.");
    } else {
      KJ_IF_SOME(expression, parser.getParsers().expression(parserInput)) {
        // The input is expected to contain a *single* expression.
        if (parserInput.getPosition() == tokens.end()) {
          // Hooray, now parse it.
          KJ_IF_SOME(compiledType,
              sourceFiles[0].compiled.evalType(expression.getReader(), errorReporter)) {
            KJ_IF_SOME(type, compiledType.getSchema()) {
              if (type.isStruct()) {
                rootType = type.asStruct();
                success = true;
              } else {
                errorReporter.addError(0, 0, "Type is not a struct.");
              }
            } else {
              // Apparently named a file scope.
              errorReporter.addError(0, 0, "Type is not a struct.");
            }
          }
        } else {
          errorReporter.addErrorOn(parserInput.current(), "Couldn't parse type name.");
        }
      }